

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O0

iterator __thiscall
CP::list<CP::list<int>_>::insert(list<CP::list<int>_> *this,iterator it,list<int> *element)

{
  node *this_00;
  node *n;
  list<int> *element_local;
  list<CP::list<int>_> *this_local;
  iterator it_local;
  
  this_00 = (node *)operator_new(0x20);
  node::node(this_00,element,(it.ptr)->prev,it.ptr);
  (it.ptr)->prev->next = this_00;
  (it.ptr)->prev = this_00;
  this->mSize = this->mSize + 1;
  list_iterator::list_iterator(&it_local,this_00);
  return (iterator)it_local.ptr;
}

Assistant:

iterator insert(iterator it,const T& element) {
      node *n = new node(element,it.ptr->prev, it.ptr);
      it.ptr->prev->next = n;
      it.ptr->prev = n;
      mSize++;
      return iterator(n);
    }